

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O1

Scrubber *
ApprovalTests::Scrubbers::createRegexScrubber
          (Scrubber *__return_storage_ptr__,string *regexString,string *replacementText)

{
  regex rStack_38;
  
  if (regexString->_M_string_length == 0) {
    *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
    (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
    __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
    *(code **)&(__return_storage_ptr__->super__Function_base)._M_functor = doNothing;
    __return_storage_ptr__->_M_invoker =
         ::std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         ::_M_invoke;
    (__return_storage_ptr__->super__Function_base)._M_manager =
         ::std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         ::_M_manager;
  }
  else {
    ::std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&rStack_38,regexString,0x10);
    createRegexScrubber(__return_storage_ptr__,&rStack_38,replacementText);
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&rStack_38);
  }
  return __return_storage_ptr__;
}

Assistant:

Scrubber createRegexScrubber(const std::string& regexString,
                                     const std::string& replacementText)
        {
            if (regexString.empty())
            {
                return doNothing;
            }
            return createRegexScrubber(std::regex(regexString), replacementText);
        }